

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS ref_import_msh(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  REF_INT RVar2;
  REF_INT RVar3;
  REF_INT RVar4;
  int iVar5;
  uint uVar6;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_LONG ref_private_status_reis_bi_21;
  REF_LONG ref_private_status_reis_ai_21;
  REF_LONG ref_private_status_reis_bi_20;
  REF_LONG ref_private_status_reis_ai_20;
  REF_INT tag;
  REF_INT cell_node;
  REF_LONG ref_private_status_reis_bi_19;
  REF_LONG ref_private_status_reis_ai_19;
  int i_1;
  int n_1;
  int entity_tag_1;
  int entity_dim_1;
  REF_LONG ref_private_status_reis_bi_18;
  REF_LONG ref_private_status_reis_ai_18;
  uint local_6d0;
  int maxtag_1;
  int mintag_1;
  int nbloc_1;
  int bloc_1;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_LONG ref_private_status_reis_bi_17;
  REF_LONG ref_private_status_reis_ai_17;
  long lStack_6a8;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_LONG ref_private_status_reis_bi_16;
  REF_LONG ref_private_status_reis_ai_16;
  REF_LONG ref_private_status_reis_bi_15;
  REF_LONG ref_private_status_reis_ai_15;
  long lStack_680;
  int node_tag;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  int local_668;
  int i;
  int n;
  int parameric;
  int entity_tag;
  int entity_dim;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_GLOB global;
  int maxtag;
  int mintag;
  int nbloc;
  int bloc;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  int datasize;
  int filetype;
  double version;
  long lStack_5e8;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  long lStack_5c0;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  long lStack_598;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL verbose;
  REF_INT type;
  REF_INT nelem;
  REF_INT status;
  REF_INT new_cell;
  REF_INT nodes [27];
  int local_4a4;
  int local_4a0;
  REF_INT tri;
  REF_INT ntri;
  REF_INT id;
  REF_INT n9;
  REF_INT n4;
  REF_INT n3;
  REF_INT n2;
  REF_INT n1;
  REF_INT n0;
  REF_INT edge;
  REF_INT nedge;
  REF_INT new_node;
  REF_INT node;
  REF_INT nnode;
  REF_INT dim;
  REF_DBL z;
  REF_DBL y;
  REF_DBL x;
  char local_448 [4];
  REF_INT dummy;
  char line [1024];
  FILE *file;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_private_status_reis_ai._4_4_ = 1;
  ref_private_status_reis_ai._0_4_ = ref_grid_create(ref_grid_ptr,ref_mpi);
  if ((uint)ref_private_status_reis_ai == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node_00 = pRVar1->node;
    line._1016_8_ = fopen(filename,"r");
    if ((FILE *)line._1016_8_ == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
    }
    if (line._1016_8_ == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x3e6,"ref_import_msh","unable to open file");
      ref_grid_ptr_local._4_4_ = 2;
    }
    else {
      while (iVar5 = feof((FILE *)line._1016_8_), iVar5 == 0) {
        type = __isoc99_fscanf(line._1016_8_,"%s",local_448);
        if (type == -1) {
          return 0;
        }
        ref_private_status_reis_bi = 1;
        ref_private_status_reis_ai_1 = (REF_LONG)type;
        if (ref_private_status_reis_ai_1 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x3eb,"ref_import_msh","line read failed",1,ref_private_status_reis_ai_1);
          return 1;
        }
        iVar5 = strcmp("Dimension",local_448);
        if (iVar5 == 0) {
          ref_private_status_reis_bi_1 = 1;
          iVar5 = __isoc99_fscanf(line._1016_8_,"%d",&node);
          ref_private_status_reis_ai_2 = (REF_LONG)iVar5;
          if (ref_private_status_reis_bi_1 != ref_private_status_reis_ai_2) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x3f0,"ref_import_msh","read dim",ref_private_status_reis_bi_1,
                   ref_private_status_reis_ai_2);
            return 1;
          }
          if (node == 2) {
            pRVar1->twod = 1;
          }
        }
        iVar5 = strcmp("Vertices",local_448);
        if (iVar5 == 0) {
          ref_private_status_reis_bi_2 = 1;
          iVar5 = __isoc99_fscanf(line._1016_8_,"%d",&new_node);
          ref_private_status_reis_ai_3 = (REF_LONG)iVar5;
          if (ref_private_status_reis_bi_2 != ref_private_status_reis_ai_3) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x3f5,"ref_import_msh","read nnode",ref_private_status_reis_bi_2,
                   ref_private_status_reis_ai_3);
            return 1;
          }
          for (nedge = 0; nedge < new_node; nedge = nedge + 1) {
            ref_private_status_reis_bi_3 = 3;
            iVar5 = __isoc99_fscanf(line._1016_8_,"%lf %lf %d",&y,&z,(long)&x + 4);
            _ref_private_macro_code_rss_2 = (long)iVar5;
            if (ref_private_status_reis_bi_3 != _ref_private_macro_code_rss_2) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x3f7,"ref_import_msh","read xy",ref_private_status_reis_bi_3,
                     _ref_private_macro_code_rss_2);
              return 1;
            }
            ref_private_status_reis_ai_4._4_4_ = ref_node_add(ref_node_00,(long)nedge,&edge);
            if (ref_private_status_reis_ai_4._4_4_ != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x3f8,"ref_import_msh",(ulong)ref_private_status_reis_ai_4._4_4_,"add node");
              return ref_private_status_reis_ai_4._4_4_;
            }
            ref_node_00->real[edge * 0xf] = y;
            ref_node_00->real[edge * 0xf + 1] = z;
            ref_node_00->real[edge * 0xf + 2] = 0.0;
            ref_private_status_reis_ai_4._4_4_ = 0;
          }
          ref_private_status_reis_ai_4._0_4_ =
               ref_node_initialize_n_global(ref_node_00,(long)new_node);
          if ((uint)ref_private_status_reis_ai_4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x3fd,"ref_import_msh",(ulong)(uint)ref_private_status_reis_ai_4,"init glob");
            return (uint)ref_private_status_reis_ai_4;
          }
          ref_private_status_reis_ai_4._0_4_ = 0;
        }
        iVar5 = strcmp("Edges",local_448);
        if (iVar5 == 0) {
          ref_private_status_reis_bi_4 = 1;
          iVar5 = __isoc99_fscanf(line._1016_8_,"%d",&n0);
          ref_private_status_reis_ai_5 = (REF_LONG)iVar5;
          if (ref_private_status_reis_bi_4 != ref_private_status_reis_ai_5) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x401,"ref_import_msh","read nedge",ref_private_status_reis_bi_4,
                   ref_private_status_reis_ai_5);
            return 1;
          }
          for (n1 = 0; n1 < n0; n1 = n1 + 1) {
            ref_private_status_reis_bi_5 = 3;
            iVar5 = __isoc99_fscanf(line._1016_8_,"%d %d %d",&n2,&n3,&tri);
            lStack_598 = (long)iVar5;
            if (ref_private_status_reis_bi_5 != lStack_598) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x403,"ref_import_msh","read edge",ref_private_status_reis_bi_5,lStack_598);
              return 1;
            }
            status = n2 + -1;
            new_cell = n3 + -1;
            nodes[0] = tri;
            n3 = new_cell;
            n2 = status;
            ref_private_status_reis_ai_6._4_4_ = ref_cell_add(pRVar1->cell[0],&status,&nelem);
            if (ref_private_status_reis_ai_6._4_4_ != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x40a,"ref_import_msh",(ulong)ref_private_status_reis_ai_6._4_4_,
                     "quad face for an edge");
              return ref_private_status_reis_ai_6._4_4_;
            }
            ref_private_status_reis_ai_6._4_4_ = 0;
          }
        }
        iVar5 = strcmp("Triangles",local_448);
        if (iVar5 == 0) {
          ref_private_status_reis_bi_6 = 1;
          iVar5 = __isoc99_fscanf(line._1016_8_,"%d",&local_4a0);
          ref_private_status_reis_ai_7 = (REF_LONG)iVar5;
          if (ref_private_status_reis_bi_6 != ref_private_status_reis_ai_7) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x40f,"ref_import_msh","read ntri",ref_private_status_reis_bi_6,
                   ref_private_status_reis_ai_7);
            return 1;
          }
          for (local_4a4 = 0; local_4a4 < local_4a0; local_4a4 = local_4a4 + 1) {
            ref_private_status_reis_bi_7 = 4;
            iVar5 = __isoc99_fscanf(line._1016_8_,"%d %d %d %d",&n2,&n3,&n4,&tri);
            lStack_5c0 = (long)iVar5;
            if (ref_private_status_reis_bi_7 != lStack_5c0) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x411,"ref_import_msh","read tri",ref_private_status_reis_bi_7,lStack_5c0);
              return 1;
            }
            status = n2 + -1;
            new_cell = n3 + -1;
            nodes[0] = n4 + -1;
            nodes[1] = tri;
            n4 = nodes[0];
            n3 = new_cell;
            n2 = status;
            ref_private_status_reis_ai_8._4_4_ = ref_cell_add(pRVar1->cell[3],&status,&nelem);
            if (ref_private_status_reis_ai_8._4_4_ != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x41a,"ref_import_msh",(ulong)ref_private_status_reis_ai_8._4_4_,
                     "tri face for tri");
              return ref_private_status_reis_ai_8._4_4_;
            }
            ref_private_status_reis_ai_8._4_4_ = 0;
          }
        }
        iVar5 = strcmp("Quadrilaterals",local_448);
        if (iVar5 == 0) {
          ref_private_status_reis_bi_8 = 1;
          iVar5 = __isoc99_fscanf(line._1016_8_,"%d",&local_4a0);
          ref_private_status_reis_ai_9 = (REF_LONG)iVar5;
          if (ref_private_status_reis_bi_8 != ref_private_status_reis_ai_9) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x41f,"ref_import_msh","read ntri",ref_private_status_reis_bi_8,
                   ref_private_status_reis_ai_9);
            return 1;
          }
          for (local_4a4 = 0; local_4a4 < local_4a0; local_4a4 = local_4a4 + 1) {
            ref_private_status_reis_bi_9 = 5;
            iVar5 = __isoc99_fscanf(line._1016_8_,"%d %d %d %d %d",&n2,&n3,&n4,&n9,&tri);
            lStack_5e8 = (long)iVar5;
            if (ref_private_status_reis_bi_9 != lStack_5e8) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x422,"ref_import_msh","read quad",ref_private_status_reis_bi_9,lStack_5e8);
              return 1;
            }
            status = n2 + -1;
            new_cell = n3 + -1;
            nodes[0] = n4 + -1;
            nodes[1] = n9 + -1;
            nodes[2] = tri;
            n9 = nodes[1];
            n4 = nodes[0];
            n3 = new_cell;
            n2 = status;
            version._4_4_ = ref_cell_add(pRVar1->cell[6],&status,&nelem);
            if (version._4_4_ != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x42d,"ref_import_msh",(ulong)version._4_4_,"qua face for qua");
              return version._4_4_;
            }
            version._4_4_ = 0;
          }
        }
        iVar5 = strcmp("$MeshFormat",local_448);
        if (iVar5 == 0) {
          ref_private_status_reis_bi_10 = 3;
          iVar5 = __isoc99_fscanf(line._1016_8_,"%lf %d %d",&datasize,
                                  (long)&ref_private_status_reis_ai_10 + 4,
                                  &ref_private_status_reis_ai_10);
          ref_private_status_reis_ai_11 = (REF_LONG)iVar5;
          if (ref_private_status_reis_bi_10 != ref_private_status_reis_ai_11) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x435,"ref_import_msh","read version file-type data-size",
                   ref_private_status_reis_bi_10,ref_private_status_reis_ai_11);
            return 1;
          }
          ref_private_status_reis_bi_11 = 0;
          ref_private_status_reis_ai_12 = (REF_LONG)ref_private_status_reis_ai_10._4_4_;
          if (ref_private_status_reis_ai_12 != 0) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x436,"ref_import_msh","only ASCII implemented",0,ref_private_status_reis_ai_12)
            ;
            return 1;
          }
          ref_private_status_reis_bi_12 = 8;
          _nbloc = (long)(int)ref_private_status_reis_ai_10;
          if (_nbloc != 8) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x437,"ref_import_msh","only doubles implemented",8,_nbloc);
            return 1;
          }
          if (ref_private_status_reis_ai._4_4_ != 0) {
            printf("$MeshFormat %3.1f\n",_datasize);
          }
        }
        iVar5 = strcmp("$Nodes",local_448);
        if (iVar5 == 0) {
          ref_private_status_reis_ai_13 = 0;
          ref_private_status_reis_bi_13 = 4;
          iVar5 = __isoc99_fscanf(line._1016_8_,"%d %d %d %d",&maxtag,&new_node,(long)&global + 4,
                                  &global);
          _entity_tag = (long)iVar5;
          if (ref_private_status_reis_bi_13 != _entity_tag) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x440,"ref_import_msh","n entity bloc, nnode, min/max tag",
                   ref_private_status_reis_bi_13,_entity_tag);
            return 1;
          }
          if (ref_private_status_reis_ai._4_4_ != 0) {
            printf("$Nodes\n%d %d %d %d\n",(ulong)(uint)maxtag,(ulong)(uint)new_node,
                   (ulong)global._4_4_,(ulong)(uint)global);
          }
          for (mintag = 0; mintag < maxtag; mintag = mintag + 1) {
            ref_private_status_reis_bi_14 = 4;
            iVar5 = __isoc99_fscanf(line._1016_8_,"%d %d %d %d",&parameric,&n,&i,&local_668);
            lStack_680 = (long)iVar5;
            if (ref_private_status_reis_bi_14 != lStack_680) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x449,"ref_import_msh",
                     "numEntityBlocks(size_t) numNodes(size_t) minNodeTag(size_t) maxNodeTag(size_t)"
                     ,ref_private_status_reis_bi_14,lStack_680);
              return 1;
            }
            for (ref_private_status_reis_ai_14._4_4_ = 0;
                ref_private_status_reis_ai_14._4_4_ < local_668;
                ref_private_status_reis_ai_14._4_4_ = ref_private_status_reis_ai_14._4_4_ + 1) {
              ref_private_status_reis_bi_15 = 1;
              iVar5 = __isoc99_fscanf(line._1016_8_,"%d",(long)&ref_private_status_reis_ai_15 + 4);
              ref_private_status_reis_ai_16 = (REF_LONG)iVar5;
              if (ref_private_status_reis_bi_15 != ref_private_status_reis_ai_16) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x44c,"ref_import_msh","node tag",ref_private_status_reis_bi_15,
                       ref_private_status_reis_ai_16);
                return 1;
              }
            }
            for (ref_private_status_reis_ai_14._4_4_ = 0;
                ref_private_status_reis_ai_14._4_4_ < local_668;
                ref_private_status_reis_ai_14._4_4_ = ref_private_status_reis_ai_14._4_4_ + 1) {
              ref_private_status_reis_bi_16 = 3;
              iVar5 = __isoc99_fscanf(line._1016_8_,"%lf %lf %lf",&y,&z,&nnode);
              lStack_6a8 = (long)iVar5;
              if (ref_private_status_reis_bi_16 != lStack_6a8) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x44f,"ref_import_msh","node tag",ref_private_status_reis_bi_16,lStack_6a8);
                return 1;
              }
              ref_private_status_reis_ai_17._4_4_ =
                   ref_node_add(ref_node_00,ref_private_status_reis_ai_13,&edge);
              if (ref_private_status_reis_ai_17._4_4_ != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x450,"ref_import_msh",(ulong)ref_private_status_reis_ai_17._4_4_,"add node"
                      );
                return ref_private_status_reis_ai_17._4_4_;
              }
              ref_private_status_reis_ai_13 = ref_private_status_reis_ai_13 + 1;
              ref_node_00->real[edge * 0xf] = y;
              ref_node_00->real[edge * 0xf + 1] = z;
              ref_node_00->real[edge * 0xf + 2] = _nnode;
              ref_private_status_reis_ai_17._4_4_ = 0;
            }
          }
          ref_private_status_reis_bi_17 = (REF_LONG)new_node;
          _bloc_1 = ref_private_status_reis_ai_13;
          if (ref_private_status_reis_bi_17 != ref_private_status_reis_ai_13) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x457,"ref_import_msh","node count",ref_private_status_reis_bi_17,
                   ref_private_status_reis_ai_13);
            return 1;
          }
          nbloc_1 = ref_node_initialize_n_global(ref_node_00,(long)new_node);
          if (nbloc_1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x458,"ref_import_msh",(ulong)(uint)nbloc_1,"init glob");
            return nbloc_1;
          }
          nbloc_1 = 0;
        }
        iVar5 = strcmp("$Elements",local_448);
        if (iVar5 == 0) {
          ref_private_status_reis_bi_18 = 4;
          iVar5 = __isoc99_fscanf(line._1016_8_,"%d %d %d %d",&maxtag_1,&verbose,&local_6d0,
                                  (long)&ref_private_status_reis_ai_18 + 4);
          _entity_tag_1 = (long)iVar5;
          if (ref_private_status_reis_bi_18 != _entity_tag_1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x45e,"ref_import_msh","n entity bloc, nnode, min/max tag",
                   ref_private_status_reis_bi_18,_entity_tag_1);
            return 1;
          }
          if (ref_private_status_reis_ai._4_4_ != 0) {
            printf("$Elements\n%d %d %d %d\n",(ulong)(uint)maxtag_1,(ulong)(uint)verbose,
                   (ulong)local_6d0,(ulong)ref_private_status_reis_ai_18._4_4_);
          }
          for (mintag_1 = 0; mintag_1 < maxtag_1; mintag_1 = mintag_1 + 1) {
            ref_private_status_reis_bi_19 = 4;
            iVar5 = __isoc99_fscanf(line._1016_8_,"%d %d %d %d",&n_1,&i_1,
                                    &ref_private_macro_code_rss,
                                    (long)&ref_private_status_reis_ai_19 + 4);
            _tag = (long)iVar5;
            if (ref_private_status_reis_bi_19 != _tag) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x466,"ref_import_msh",
                     "entityDim(int) entityTag(int) elementType(int) numElementsInBlock(size_t)",
                     ref_private_status_reis_bi_19,_tag);
              return 1;
            }
            if (ref_private_status_reis_ai._4_4_ != 0) {
              printf("element bloc %d of %d\n",(ulong)ref_private_status_reis_ai_19._4_4_,
                     (ulong)(uint)ref_private_macro_code_rss);
            }
            switch(ref_private_macro_code_rss) {
            case 1:
              file = (FILE *)pRVar1->cell[0];
              break;
            case 2:
              file = (FILE *)pRVar1->cell[3];
              break;
            case 3:
              file = (FILE *)pRVar1->cell[6];
              break;
            case 4:
              file = (FILE *)pRVar1->cell[8];
              break;
            case 5:
              file = (FILE *)pRVar1->cell[0xb];
              break;
            case 6:
              file = (FILE *)pRVar1->cell[10];
              break;
            case 7:
              file = (FILE *)pRVar1->cell[9];
              break;
            case 8:
              file = (FILE *)pRVar1->cell[1];
              break;
            case 9:
              file = (FILE *)pRVar1->cell[4];
              break;
            default:
              printf("type = %d\n",(ulong)(uint)ref_private_macro_code_rss);
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x48f,"ref_import_msh","unknown $Elements type");
              return 1;
            case 0xb:
              file = (FILE *)pRVar1->cell[0xc];
              break;
            case 0x15:
              file = (FILE *)pRVar1->cell[5];
              break;
            case 0x1a:
              file = (FILE *)pRVar1->cell[2];
            }
            for (ref_private_status_reis_ai_19._0_4_ = 0;
                (int)ref_private_status_reis_ai_19 < (int)ref_private_status_reis_ai_19._4_4_;
                ref_private_status_reis_ai_19._0_4_ = (int)ref_private_status_reis_ai_19 + 1) {
              iVar5 = __isoc99_fscanf(line._1016_8_,"%d",&ref_private_status_reis_ai_20);
              if ((long)iVar5 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x493,"ref_import_msh","elementTag(size_t)",1,(long)iVar5);
                return 1;
              }
              for (ref_private_status_reis_ai_20._4_4_ = 0;
                  ref_private_status_reis_ai_20._4_4_ < *(int *)((long)&file->_IO_read_ptr + 4);
                  ref_private_status_reis_ai_20._4_4_ = ref_private_status_reis_ai_20._4_4_ + 1) {
                iVar5 = __isoc99_fscanf(line._1016_8_,"%d",
                                        &status + ref_private_status_reis_ai_20._4_4_);
                if ((long)iVar5 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x495,"ref_import_msh","nodeTag(size_t)",1,(long)iVar5);
                  return 1;
                }
                (&status)[ref_private_status_reis_ai_20._4_4_] =
                     (&status)[ref_private_status_reis_ai_20._4_4_] + -1;
              }
              if (*(int *)&file->field_0x4 != 0) {
                (&status)[*(int *)((long)&file->_IO_read_ptr + 4)] =
                     (REF_INT)ref_private_status_reis_ai_20;
              }
              RVar4 = nodes[7];
              RVar3 = nodes[0];
              RVar2 = new_cell;
              if (file->_flags == 9) {
                n2 = status;
                n3 = new_cell;
                n4 = nodes[0];
                n9 = nodes[1];
                id = nodes[2];
                new_cell = nodes[1];
                nodes[0] = nodes[2];
                nodes[1] = RVar2;
                nodes[2] = RVar3;
              }
              if (file->_flags == 0xc) {
                ntri = nodes[7];
                nodes[7] = nodes[6];
                nodes[6] = RVar4;
              }
              uVar6 = ref_cell_add((REF_CELL)file,&status,&nelem);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x4ab,"ref_import_msh",(ulong)uVar6,"add $Element");
                return uVar6;
              }
            }
          }
        }
      }
      fclose((FILE *)line._1016_8_);
      ref_grid_ptr_local._4_4_ = 6;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x3e0,
           "ref_import_msh",(ulong)(uint)ref_private_status_reis_ai,"create grid");
    ref_grid_ptr_local._4_4_ = (uint)ref_private_status_reis_ai;
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_import_msh(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi,
                                         const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  char line[1024];
  REF_INT dummy;
  REF_DBL x, y, z;
  REF_INT dim, nnode, node, new_node;
  REF_INT nedge, edge, n0, n1, n2, n3, n4, n9, id;
  REF_INT ntri, tri;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], new_cell;
  REF_INT status;
  REF_INT nelem, type;
  REF_BOOL verbose = REF_TRUE;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  while (!feof(file)) {
    status = fscanf(file, "%s", line);
    if (EOF == status) return REF_SUCCESS;
    REIS(1, status, "line read failed");

    /* keywords without a leading $ are for BAMG */

    if (0 == strcmp("Dimension", line)) {
      REIS(1, fscanf(file, "%d", &dim), "read dim");
      if (2 == dim) ref_grid_twod(ref_grid) = REF_TRUE;
    }

    if (0 == strcmp("Vertices", line)) {
      REIS(1, fscanf(file, "%d", &nnode), "read nnode");
      for (node = 0; node < nnode; node++) {
        REIS(3, fscanf(file, "%lf %lf %d", &x, &y, &dummy), "read xy");
        RSS(ref_node_add(ref_node, node, &new_node), "add node");
        ref_node_xyz(ref_node, 0, new_node) = x;
        ref_node_xyz(ref_node, 1, new_node) = y;
        ref_node_xyz(ref_node, 2, new_node) = 0.0;
      }
      RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");
    }

    if (0 == strcmp("Edges", line)) {
      REIS(1, fscanf(file, "%d", &nedge), "read nedge");
      for (edge = 0; edge < nedge; edge++) {
        REIS(3, fscanf(file, "%d %d %d", &n0, &n1, &id), "read edge");
        n0--;
        n1--;
        nodes[0] = n0;
        nodes[1] = n1;
        nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &new_cell),
            "quad face for an edge");
      }
    }

    if (0 == strcmp("Triangles", line)) {
      REIS(1, fscanf(file, "%d", &ntri), "read ntri");
      for (tri = 0; tri < ntri; tri++) {
        REIS(4, fscanf(file, "%d %d %d %d", &n0, &n1, &n2, &id), "read tri");
        n0--;
        n1--;
        n2--;
        nodes[0] = n0;
        nodes[1] = n1;
        nodes[2] = n2;
        nodes[3] = id;
        RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &new_cell),
            "tri face for tri");
      }
    }

    if (0 == strcmp("Quadrilaterals", line)) {
      REIS(1, fscanf(file, "%d", &ntri), "read ntri");
      for (tri = 0; tri < ntri; tri++) {
        REIS(5, fscanf(file, "%d %d %d %d %d", &n0, &n1, &n2, &n3, &id),
             "read quad");
        n0--;
        n1--;
        n2--;
        n3--;
        nodes[0] = n0;
        nodes[1] = n1;
        nodes[2] = n2;
        nodes[3] = n3;
        nodes[4] = id;
        RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell),
            "qua face for qua");
      }
    }

    if (0 == strcmp("$MeshFormat", line)) {
      double version;
      int filetype, datasize;
      REIS(3, fscanf(file, "%lf %d %d", &version, &filetype, &datasize),
           "read version file-type data-size");
      REIS(0, filetype, "only ASCII implemented")
      REIS(8, datasize, "only doubles implemented")
      if (verbose) printf("$MeshFormat %3.1f\n", version);
    }

    if (0 == strcmp("$Nodes", line)) {
      int bloc, nbloc, mintag, maxtag;
      REF_GLOB global;
      global = 0;
      REIS(4, fscanf(file, "%d %d %d %d", &nbloc, &nnode, &mintag, &maxtag),
           "n entity bloc, nnode, min/max tag");
      if (verbose)
        printf("$Nodes\n%d %d %d %d\n", nbloc, nnode, mintag, maxtag);
      for (bloc = 0; bloc < nbloc; bloc++) {
        int entity_dim, entity_tag, parameric, n, i;
        REIS(4,
             fscanf(file, "%d %d %d %d", &entity_dim, &entity_tag, &parameric,
                    &n),
             "numEntityBlocks(size_t) numNodes(size_t) minNodeTag(size_t) "
             "maxNodeTag(size_t)");
        for (i = 0; i < n; i++) {
          int node_tag;
          REIS(1, fscanf(file, "%d", &node_tag), "node tag");
        }
        for (i = 0; i < n; i++) {
          REIS(3, fscanf(file, "%lf %lf %lf", &x, &y, &z), "node tag");
          RSS(ref_node_add(ref_node, global, &new_node), "add node");
          global++;
          ref_node_xyz(ref_node, 0, new_node) = x;
          ref_node_xyz(ref_node, 1, new_node) = y;
          ref_node_xyz(ref_node, 2, new_node) = z;
        }
      }
      REIS(nnode, global, "node count");
      RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");
    }

    if (0 == strcmp("$Elements", line)) {
      int bloc, nbloc, mintag, maxtag;
      REIS(4, fscanf(file, "%d %d %d %d", &nbloc, &nelem, &mintag, &maxtag),
           "n entity bloc, nnode, min/max tag");
      if (verbose)
        printf("$Elements\n%d %d %d %d\n", nbloc, nelem, mintag, maxtag);
      for (bloc = 0; bloc < nbloc; bloc++) {
        int entity_dim, entity_tag, n, i;
        REIS(4,
             fscanf(file, "%d %d %d %d", &entity_dim, &entity_tag, &type, &n),
             "entityDim(int) entityTag(int) elementType(int) "
             "numElementsInBlock(size_t)");
        if (verbose) printf("element bloc %d of %d\n", n, type);
        switch (type) {
          case 1:
            ref_cell = ref_grid_edg(ref_grid);
            break;
          case 2:
            ref_cell = ref_grid_tri(ref_grid);
            break;
          case 3:
            ref_cell = ref_grid_qua(ref_grid);
            break;
          case 4:
            ref_cell = ref_grid_tet(ref_grid);
            break;
          case 5:
            ref_cell = ref_grid_hex(ref_grid);
            break;
          case 6:
            ref_cell = ref_grid_pri(ref_grid);
            break;
          case 7:
            ref_cell = ref_grid_pyr(ref_grid);
            break;
          case 8:
            ref_cell = ref_grid_ed2(ref_grid);
            break;
          case 9:
            ref_cell = ref_grid_tr2(ref_grid);
            break;
          case 11:
            ref_cell = ref_grid_te2(ref_grid);
            break;
          case 21:
            ref_cell = ref_grid_tr3(ref_grid);
            break;
          case 26:
            ref_cell = ref_grid_ed3(ref_grid);
            break;
          default:
            printf("type = %d\n", type);
            THROW("unknown $Elements type");
        }
        for (i = 0; i < n; i++) {
          REF_INT cell_node, tag;
          REIS(1, fscanf(file, "%d", &tag), "elementTag(size_t)");
          each_ref_cell_cell_node(ref_cell, cell_node) {
            REIS(1, fscanf(file, "%d", &(nodes[cell_node])), "nodeTag(size_t)");
            (nodes[cell_node])--;
          }
          if (ref_cell_last_node_is_an_id(ref_cell))
            nodes[ref_cell_id_index(ref_cell)] = tag;
          if (REF_CELL_PYR == ref_cell_type(ref_cell)) { /* on side */
            n0 = nodes[0];
            n1 = nodes[1];
            n2 = nodes[2];
            n3 = nodes[3];
            n4 = nodes[4];
            nodes[0] = n0;
            nodes[1] = n3;
            nodes[2] = n4;
            nodes[3] = n1;
            nodes[4] = n2;
          }
          if (REF_CELL_TE2 == ref_cell_type(ref_cell)) { /* swap 8-9 */
            n9 = nodes[9];
            nodes[9] = nodes[8];
            nodes[8] = n9;
          }
          RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add $Element");
        }
      }
    }
  }

  fclose(file);

  return REF_IMPLEMENT;
}